

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkLock.cpp
# Opt level: O1

void __thiscall chrono::ChLinkLock::BuildLinkType(ChLinkLock *this,LinkType link_type)

{
  bool z;
  bool y;
  bool x;
  bool e1;
  bool e2;
  bool e3;
  
  this->type = link_type;
  switch(link_type) {
  case LOCK:
    x = true;
    y = true;
    break;
  case SPHERICAL:
    x = true;
    goto LAB_0058cd43;
  case POINTPLANE:
    x = false;
    y = false;
    goto LAB_0058cd48;
  case POINTLINE:
    x = false;
LAB_0058cd43:
    y = true;
LAB_0058cd48:
    z = true;
LAB_0058cd4d:
    e2 = false;
    e1 = false;
    e3 = e2;
    goto LAB_0058cdb6;
  case CYLINDRICAL:
    x = true;
    y = true;
    goto LAB_0058cd30;
  case PRISMATIC:
    x = true;
    y = true;
    goto LAB_0058cd75;
  case PLANEPLANE:
    x = false;
    y = false;
    goto LAB_0058cd89;
  case OLDHAM:
    x = false;
    y = false;
    break;
  case REVOLUTE:
    x = true;
    goto LAB_0058cd84;
  default:
    x = false;
    y = false;
    z = false;
    goto LAB_0058cd4d;
  case ALIGN:
    x = false;
    y = false;
LAB_0058cd75:
    z = false;
    goto LAB_0058cdab;
  case PARALLEL:
    x = false;
    y = false;
LAB_0058cd30:
    z = false;
LAB_0058cd8e:
    e1 = true;
    e2 = true;
    e3 = false;
    goto LAB_0058cdb6;
  case PERPEND:
    x = false;
    y = false;
    z = false;
    e1 = true;
    e2 = false;
    e3 = true;
    goto LAB_0058cdb6;
  case REVOLUTEPRISMATIC:
    x = false;
LAB_0058cd84:
    y = true;
LAB_0058cd89:
    z = true;
    goto LAB_0058cd8e;
  }
  z = true;
LAB_0058cdab:
  e2 = true;
  e1 = true;
  e3 = e2;
LAB_0058cdb6:
  ChLinkMaskLF::SetLockMask(&this->mask,x,y,z,false,e1,e2,e3);
  BuildLink(this);
  return;
}

Assistant:

void ChLinkLock::BuildLinkType(LinkType link_type) {
    type = link_type;

    // SetLockMask() sets the constraints for the link coordinates: (X,Y,Z, E0,E1,E2,E3)
    switch (type) {
        case LinkType::FREE:
            BuildLink(false, false, false, false, false, false, false);
            break;
        case LinkType::LOCK:
            // this should never happen
            BuildLink(true, true, true, false, true, true, true);
            break;
        case LinkType::SPHERICAL:
            BuildLink(true, true, true, false, false, false, false);
            break;
        case LinkType::POINTPLANE:
            BuildLink(false, false, true, false, false, false, false);
            break;
        case LinkType::POINTLINE:
            BuildLink(false, true, true, false, false, false, false);
            break;
        case LinkType::REVOLUTE:
            BuildLink(true, true, true, false, true, true, false);
            break;
        case LinkType::CYLINDRICAL:
            BuildLink(true, true, false, false, true, true, false);
            break;
        case LinkType::PRISMATIC:
            BuildLink(true, true, false, false, true, true, true);
            break;
        case LinkType::PLANEPLANE:
            BuildLink(false, false, true, false, true, true, false);
            break;
        case LinkType::OLDHAM:
            BuildLink(false, false, true, false, true, true, true);
            break;
        case LinkType::ALIGN:
            BuildLink(false, false, false, false, true, true, true);
            break;
        case LinkType::PARALLEL:
            BuildLink(false, false, false, false, true, true, false);
            break;
        case LinkType::PERPEND:
            BuildLink(false, false, false, false, true, false, true);
            break;
        case LinkType::REVOLUTEPRISMATIC:
            BuildLink(false, true, true, false, true, true, false);
            break;
        default:
            BuildLink(false, false, false, false, false, false, false);
            break;
    }
}